

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O2

void SetLoopParams(VP8Encoder *enc,float q)

{
  int iVar1;
  int *piVar2;
  WebPAuxStats *pWVar3;
  uint8_t uVar4;
  int n;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  int total;
  int iVar12;
  float fVar13;
  int local_38 [6];
  
  fVar13 = 100.0;
  if (q <= 100.0) {
    fVar13 = q;
  }
  VP8SetSegmentParams(enc,(float)(~-(uint)(q < 0.0) & (uint)fVar13));
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  uVar5 = enc->mb_h_ * enc->mb_w_;
  uVar9 = 0;
  uVar7 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar7 = uVar9;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    piVar2 = (int *)((long)local_38 + (ulong)(*(byte *)(enc->mb_info_ + uVar9) >> 3 & 0xc));
    *piVar2 = *piVar2 + 1;
  }
  pWVar3 = enc->pic_->stats;
  if (pWVar3 != (WebPAuxStats *)0x0) {
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      pWVar3->segment_size[lVar10] = local_38[lVar10];
    }
  }
  if ((enc->segment_hdr_).num_segments_ < 2) {
    (enc->segment_hdr_).update_map_ = 0;
    iVar6 = 0;
  }
  else {
    iVar6 = local_38[1] + local_38[0];
    iVar1 = local_38[3] + local_38[2];
    bVar8 = 0xff;
    bVar11 = 0xff;
    iVar12 = iVar1 + iVar6;
    if (iVar12 != 0) {
      bVar11 = (byte)((iVar12 / 2 + iVar6 * 0xff) / iVar12);
    }
    (enc->proba_).segments_[0] = bVar11;
    if (iVar6 != 0) {
      bVar8 = (byte)((iVar6 / 2 + local_38[0] * 0xff) / iVar6);
    }
    (enc->proba_).segments_[1] = bVar8;
    if (iVar1 == 0) {
      uVar7 = 0xff;
    }
    else {
      uVar7 = (long)(iVar1 / 2 + local_38[2] * 0xff) / (long)iVar1 & 0xffffffff;
    }
    uVar4 = (uint8_t)uVar7;
    (enc->proba_).segments_[2] = uVar4;
    if ((bVar11 == 0xff) && (bVar8 == 0xff)) {
      bVar8 = 0xff;
      bVar11 = 0xff;
      (enc->segment_hdr_).update_map_ = (uint)(uVar4 != 0xff);
      if (uVar4 == 0xff) {
        for (lVar10 = 0; lVar10 < (long)enc->mb_h_ * (long)enc->mb_w_; lVar10 = lVar10 + 1) {
          *(byte *)(enc->mb_info_ + lVar10) = *(byte *)(enc->mb_info_ + lVar10) & 0x9f;
        }
        bVar11 = (enc->proba_).segments_[0];
        bVar8 = (enc->proba_).segments_[1];
        uVar7 = (ulong)(enc->proba_).segments_[2];
      }
    }
    else {
      (enc->segment_hdr_).update_map_ = 1;
    }
    iVar6 = ((uint)VP8EntropyCost[(byte)~(byte)uVar7] + (uint)VP8EntropyCost[(byte)~bVar11]) *
            local_38[3] +
            ((uint)VP8EntropyCost[uVar7 & 0xff] + (uint)VP8EntropyCost[(byte)~bVar11]) * local_38[2]
            + ((uint)VP8EntropyCost[(byte)~bVar8] + (uint)VP8EntropyCost[bVar11]) * local_38[1] +
              ((uint)VP8EntropyCost[bVar8] + (uint)VP8EntropyCost[bVar11]) * local_38[0];
  }
  (enc->segment_hdr_).size_ = iVar6;
  VP8CalculateLevelCosts(&enc->proba_);
  (enc->proba_).nb_skip_ = 0;
  enc->sse_count_ = 0;
  enc->sse_[0] = 0;
  enc->sse_[1] = 0;
  enc->sse_[2] = 0;
  return;
}

Assistant:

static void SetLoopParams(VP8Encoder* const enc, float q) {
  // Make sure the quality parameter is inside valid bounds
  q = Clamp(q, 0.f, 100.f);

  VP8SetSegmentParams(enc, q);      // setup segment quantizations and filters
  SetSegmentProbas(enc);            // compute segment probabilities

  ResetStats(enc);
  ResetSSE(enc);
}